

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::RS_Limb::RS_Limb
          (RS_Limb *this,string *name,LimbID id,LinkData *data,
          shared_ptr<chrono::ChMaterialSurface> *wheel_mat,
          shared_ptr<chrono::ChMaterialSurface> *link_mat,ChSystem *system)

{
  double dVar1;
  pointer pcVar2;
  ChFrame *pCVar3;
  pointer pCVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  float fVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  long *plVar8;
  undefined8 *puVar9;
  double *pdVar10;
  pointer pCVar11;
  double *pdVar12;
  LinkData *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  shared_ptr<chrono::robosimian::RS_Part> local_1b8;
  RS_Limb *local_1a0;
  RS_Part *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  double local_188;
  long *local_178;
  undefined8 local_170;
  long alStack_168 [2];
  int local_154;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_150;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_148;
  long local_140;
  element_type *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  shared_ptr<chrono::ChMaterialSurface> *local_120;
  shared_ptr<chrono::ChMaterialSurface> *local_118;
  undefined **local_110;
  ulong local_108;
  LinkData *local_100;
  double local_f8;
  undefined1 local_f0 [136];
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_120 = wheel_mat;
  local_118 = link_mat;
  local_100 = data;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + name->_M_string_length);
  local_148 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&this->m_links;
  (this->m_links)._M_h._M_buckets = &(this->m_links)._M_h._M_single_bucket;
  (this->m_links)._M_h._M_bucket_count = 1;
  (this->m_links)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_links)._M_h._M_element_count = 0;
  (this->m_links)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_links)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_links)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_joints)._M_h._M_buckets = &(this->m_joints)._M_h._M_single_bucket;
  (this->m_joints)._M_h._M_bucket_count = 1;
  (this->m_joints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_joints)._M_h._M_element_count = 0;
  (this->m_joints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_joints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_joints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_motors)._M_h._M_buckets = &(this->m_motors)._M_h._M_single_bucket;
  (this->m_motors)._M_h._M_bucket_count = 1;
  local_108 = (ulong)(id * 4 + 4);
  (this->m_motors)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_motors)._M_h._M_element_count = 0;
  (this->m_motors)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [32])&(this->m_motors)._M_h._M_rehash_policy._M_next_resize = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])
   ((long)&(this->m_wheel).
           super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1) =
       ZEXT432(0) << 0x40;
  this->m_collide_wheel = true;
  local_150 = &(this->m_wheel).
               super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  local_110 = &PTR__ChFrame_0017db90;
  local_140 = 0;
  local_1a0 = this;
  do {
    pdVar12 = (double *)(local_f0 + 0x10);
    __x = local_100 + local_140;
    local_154 = std::__cxx11::string::compare((char *)__x);
    local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = alStack_168;
    if (local_154 == 0) {
      pcVar2 = (local_1a0->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pcVar2,pcVar2 + (local_1a0->m_name)._M_string_length);
      std::__cxx11::string::append((char *)&local_178);
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append
                         ((char *)&local_178,(ulong)(__x->name)._M_dataplus._M_p);
      pdVar10 = (double *)(puVar9 + 2);
      if ((double *)*puVar9 == pdVar10) {
        local_f0._16_8_ = *pdVar10;
        local_f0._24_8_ = puVar9[3];
        local_f0._0_8_ = pdVar12;
      }
      else {
        local_f0._16_8_ = *pdVar10;
        local_f0._0_8_ = (double *)*puVar9;
      }
      local_f0._8_8_ = puVar9[1];
      *puVar9 = pdVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      local_198 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::robosimian::RS_Part,std::allocator<chrono::robosimian::RS_Part>,std::__cxx11::string,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
                (&_Stack_190,&local_198,(allocator<chrono::robosimian::RS_Part> *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                 local_120,&system);
    }
    else {
      pcVar2 = (local_1a0->m_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pcVar2,pcVar2 + (local_1a0->m_name)._M_string_length);
      std::__cxx11::string::append((char *)&local_178);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_178,(ulong)(__x->name)._M_dataplus._M_p);
      pdVar10 = (double *)(plVar8 + 2);
      if ((double *)*plVar8 == pdVar10) {
        local_f0._16_8_ = *pdVar10;
        local_f0._24_8_ = plVar8[3];
        local_f0._0_8_ = pdVar12;
      }
      else {
        local_f0._16_8_ = *pdVar10;
        local_f0._0_8_ = (double *)*plVar8;
      }
      local_f0._8_8_ = plVar8[1];
      *plVar8 = (long)pdVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_198 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::robosimian::RS_Part,std::allocator<chrono::robosimian::RS_Part>,std::__cxx11::string,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
                (&_Stack_190,&local_198,(allocator<chrono::robosimian::RS_Part> *)&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                 local_118,&system);
    }
    _Var7._M_pi = _Stack_190._M_pi;
    local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_198;
    this_00._M_pi =
         local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    local_198 = (RS_Part *)0x0;
    _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var7._M_pi;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      if (_Stack_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_190._M_pi);
      }
    }
    if ((double *)local_f0._0_8_ != pdVar12) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if (local_178 != alStack_168) {
      operator_delete(local_178,alStack_168[0] + 1);
    }
    local_48 = (__x->link).m_com.m_data[0];
    dStack_40 = (__x->link).m_com.m_data[1];
    dVar1 = (__x->link).m_mass;
    local_f8 = (__x->link).m_com.m_data[2];
    local_198 = (RS_Part *)(__x->link).m_inertia_xx.m_data[0];
    _Stack_190._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(__x->link).m_inertia_xx.m_data[1];
    local_188 = (__x->link).m_inertia_xx.m_data[2];
    local_68 = (__x->link).m_inertia_xy.m_data[0];
    dStack_60 = (__x->link).m_inertia_xy.m_data[1];
    local_58 = (__x->link).m_inertia_xy.m_data[2];
    *(int *)(((local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr + 0x28) = (int)local_108 + (int)local_140;
    chrono::ChVariablesBodyOwnMass::SetBodyMass(dVar1);
    pCVar3 = (ChFrame *)
             ((local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_178 = (long *)0x3ff0000000000000;
    local_f0._0_8_ = local_110;
    alStack_168[1] = 0;
    local_170 = 0;
    alStack_168[0] = 0;
    local_f0._8_8_ = local_48;
    local_f0._16_8_ = dStack_40;
    local_f0._24_8_ = local_f8;
    local_f0._32_8_ = 1.0;
    local_f0._56_8_ = 0.0;
    local_f0._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f0._48_8_ = 0.0;
    ChMatrix33<double>::ChMatrix33
              ((ChMatrix33<double> *)(local_f0 + 0x40),(ChQuaternion<double> *)&local_178);
    chrono::ChBodyAuxRef::SetFrame_COG_to_REF(pCVar3);
    chrono::ChBody::SetInertiaXX
              (((local_1b8.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    chrono::ChBody::SetInertiaXY
              (((local_1b8.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
    std::__cxx11::string::_M_assign
              ((string *)
               &(local_1b8.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->m_mesh_name);
    if (&(__x->link).m_offset !=
        &(local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_offset) {
      ((local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_offset).m_data[0] = (__x->link).m_offset.m_data[0];
      ((local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_offset).m_data[1] = (__x->link).m_offset.m_data[1];
      ((local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_offset).m_data[2] = (__x->link).m_offset.m_data[2];
    }
    if (&(__x->link).m_color !=
        &(local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_color) {
      fVar6 = (__x->link).m_color.G;
      ((local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_color).R = (__x->link).m_color.R;
      ((local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_color).G = fVar6;
      ((local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       )->m_color).B = (__x->link).m_color.B;
    }
    pCVar4 = (__x->link).m_shapes.
             super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar11 = (__x->link).m_shapes.
                   super__Vector_base<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
                   ._M_impl.super__Vector_impl_data._M_start; pCVar11 != pCVar4;
        pCVar11 = pCVar11 + 1) {
      local_f0._0_8_ = (pCVar11->m_pos).m_data[0];
      local_f0._8_8_ = (pCVar11->m_pos).m_data[1];
      local_f0._16_8_ = (pCVar11->m_pos).m_data[2];
      local_f0._24_8_ = (pCVar11->m_rot).m_data[0];
      local_f0._32_8_ = (pCVar11->m_rot).m_data[1];
      local_f0._40_8_ = (pCVar11->m_rot).m_data[2];
      local_f0._48_8_ = (pCVar11->m_rot).m_data[3];
      local_f0._56_8_ = pCVar11->m_radius;
      local_f0._64_8_ = pCVar11->m_length;
      std::
      vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
      ::push_back(&(local_1b8.
                    super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_cylinders,(value_type *)local_f0);
    }
    if (__x->include != false) {
      local_138 = ((local_1b8.
                    super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_body).
                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Stack_130 = ((local_1b8.
                      super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_body).
                    super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi;
      p_Var5 = ((local_1b8.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      chrono::ChSystem::Add(system,&local_138);
      if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
    ::pair<std::shared_ptr<chrono::robosimian::RS_Part>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::robosimian::RS_Part>_>
                *)local_f0,&__x->name,&local_1b8);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<chrono::robosimian::RS_Part>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<chrono::robosimian::RS_Part>>>
              (local_148,(value_type *)local_f0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._40_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._40_8_);
    }
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if (local_154 == 0) {
      (local_1a0->m_wheel).
      super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_150,
                 &local_1b8.
                  super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    if (local_1b8.super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.
                 super___shared_ptr<chrono::robosimian::RS_Part,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_140 = local_140 + 1;
  } while (local_140 != 0xb);
  return;
}

Assistant:

RS_Limb::RS_Limb(const std::string& name,
                 LimbID id,
                 const LinkData data[],
                 std::shared_ptr<ChMaterialSurface> wheel_mat,
                 std::shared_ptr<ChMaterialSurface> link_mat,
                 ChSystem* system)
    : m_name(name), m_collide_links(false), m_collide_wheel(true) {
    for (int i = 0; i < num_links; i++) {
        bool is_wheel = (data[i].name.compare("link8") == 0);

        std::shared_ptr<RS_Part> link;
        if (is_wheel) {
            link = chrono_types::make_shared<RS_Part>(m_name + "_" + data[i].name, wheel_mat, system);
        } else {
            link = chrono_types::make_shared<RS_Part>(m_name + "_" + data[i].name, link_mat, system);
        }

        double mass = data[i].link.m_mass;
        ChVector<> com = data[i].link.m_com;
        ChVector<> inertia_xx = data[i].link.m_inertia_xx;
        ChVector<> inertia_xy = data[i].link.m_inertia_xy;

        link->m_body->SetIdentifier(4 + 4 * id + i);
        link->m_body->SetMass(mass);
        link->m_body->SetFrame_COG_to_REF(ChFrame<>(com, ChQuaternion<>(1, 0, 0, 0)));
        link->m_body->SetInertiaXX(inertia_xx);
        link->m_body->SetInertiaXY(inertia_xy);

        link->m_mesh_name = data[i].link.m_mesh_name;
        link->m_offset = data[i].link.m_offset;
        link->m_color = data[i].link.m_color;

        for (auto cyl : data[i].link.m_shapes) {
            link->m_cylinders.push_back(cyl);
        }

        if (data[i].include)
            system->Add(link->m_body);

        m_links.insert(std::make_pair(data[i].name, link));
        if (is_wheel)
            m_wheel = link;
    }
}